

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# response_test.cpp
# Opt level: O1

string * remove_brakets(string *__return_storage_ptr__,string *in)

{
  char cVar1;
  ulong uVar2;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (in->_M_string_length != 0) {
    uVar2 = 0;
    do {
      cVar1 = (in->_M_dataplus)._M_p[uVar2];
      if ((cVar1 != '[') && (cVar1 != ']')) {
        std::__cxx11::string::push_back((char)__return_storage_ptr__);
      }
      uVar2 = uVar2 + 1;
    } while (uVar2 < in->_M_string_length);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string remove_brakets(std::string const &in)
{
    std::string r;
    for(size_t i=0;i<in.size();i++)
        if(in[i]!='[' && in[i]!=']')
            r+= in[i];
    return r;
}